

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::drawSubtreeRecursive
          (QGraphicsScenePrivate *this,QGraphicsItem *item,QPainter *painter,
          QTransform *viewTransform,QRegion *exposedRegion,QWidget *widget,qreal parentOpacity,
          QTransform *effectTransform)

{
  double dVar1;
  quint32 qVar2;
  long lVar3;
  QGraphicsItemPrivate *pQVar4;
  ulong uVar5;
  ulong uVar6;
  QGraphicsEffect *pQVar7;
  QGraphicsItemEffectSourcePrivate *this_00;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  char cVar11;
  int iVar12;
  qreal *pqVar13;
  QTransform *pQVar14;
  undefined1 *puVar15;
  long lVar16;
  long lVar17;
  QTransform *pQVar18;
  undefined8 *puVar19;
  QTransform *pQVar20;
  QGraphicsItemPaintInfo *pQVar21;
  long in_FS_OFFSET;
  bool bVar22;
  byte bVar23;
  qreal opacity;
  undefined1 auVar24 [16];
  QRectF local_198;
  QWidget *widget_local;
  QGraphicsItemPaintInfo info;
  QTransform local_128;
  QTransform local_d8;
  QTransform transform;
  
  bVar23 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (item->d_ptr).d;
  uVar5 = *(ulong *)&pQVar4->field_0x160;
  widget_local = widget;
  if ((((uVar5 & 0x20) == 0) ||
      (lVar17 = (pQVar4->children).d.size, ((byte)(uVar5 >> 0x2a) & lVar17 == 0) != 0)) ||
     ((opacity = QGraphicsItemPrivate::combineOpacityFromParent(pQVar4,parentOpacity),
      opacity < 0.001 &&
      ((lVar17 == 0 ||
       (bVar9 = QGraphicsItemPrivate::childrenCombineOpacity((item->d_ptr).d), bVar9))))))
  goto LAB_0059e260;
  pQVar14 = &transform;
  pqVar13 = (qreal *)&DAT_006795c0;
  pQVar18 = pQVar14;
  for (lVar16 = 10; lVar16 != 0; lVar16 = lVar16 + -1) {
    pQVar18->m_matrix[0][0] = *pqVar13;
    pqVar13 = pqVar13 + (ulong)bVar23 * -2 + 1;
    pQVar18 = (QTransform *)((long)pQVar18 + (ulong)bVar23 * -0x10 + 8);
  }
  pQVar4 = (item->d_ptr).d;
  uVar6 = *(ulong *)&pQVar4->field_0x160;
  if ((uVar6 & 0x2000040000) == 0) {
    bVar9 = (uVar6 >> 0x35 & 1) != 0;
    if (bVar9) {
      (*pQVar4->_vptr_QGraphicsItemPrivate[2])();
    }
    pQVar14 = (QTransform *)0x0;
  }
  else {
    if (viewTransform == (QTransform *)0x0) {
      pqVar13 = (qreal *)&DAT_00679578;
      pQVar18 = &local_128;
      for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
        pQVar18->m_matrix[0][0] = *pqVar13;
        pqVar13 = pqVar13 + (ulong)bVar23 * -2 + 1;
        pQVar18 = (QTransform *)((long)pQVar18 + ((ulong)bVar23 * -2 + 1) * 8);
      }
      local_128._72_2_ = 0;
    }
    else {
      pQVar18 = viewTransform;
      pQVar20 = &local_128;
      for (lVar16 = 0x4a; lVar16 != 0; lVar16 = lVar16 + -1) {
        *(undefined1 *)pQVar20->m_matrix[0] = *(undefined1 *)pQVar18->m_matrix[0];
        pQVar18 = (QTransform *)((long)pQVar18 + (ulong)bVar23 * -2 + 1);
        pQVar20 = (QTransform *)((long)pQVar20 + (ulong)bVar23 * -2 + 1);
      }
    }
    QGraphicsItem::deviceTransform(&local_d8,item,&local_128);
    pQVar18 = &local_d8;
    pQVar20 = pQVar14;
    for (lVar16 = 0x4a; lVar16 != 0; lVar16 = lVar16 + -1) {
      *(undefined1 *)pQVar20->m_matrix[0] = *(undefined1 *)pQVar18->m_matrix[0];
      pQVar18 = (QTransform *)((long)pQVar18 + (ulong)bVar23 * -2 + 1);
      pQVar20 = (QTransform *)((long)pQVar20 + (ulong)bVar23 * -2 + 1);
    }
    bVar9 = false;
  }
  bVar22 = (uVar5 >> 0x2a & 1) == 0;
  pQVar4 = (item->d_ptr).d;
  uVar5 = *(ulong *)&pQVar4->field_0x160;
  bVar8 = bVar22 && 0.001 <= opacity;
  if ((bVar8) || (0.0 < this->minimumRenderSize)) {
    local_d8.m_matrix[0][2]._0_4_ = 0xffffffff;
    local_d8.m_matrix[0][2]._4_4_ = 0xffffffff;
    local_d8.m_matrix[1][0]._0_4_ = 0xffffffff;
    local_d8.m_matrix[1][0]._4_4_ = 0xffffffff;
    local_d8.m_matrix[0][0]._0_4_ = 0xffffffff;
    local_d8.m_matrix[0][0]._4_4_ = 0xffffffff;
    local_d8.m_matrix[0][1]._0_4_ = 0xffffffff;
    local_d8.m_matrix[0][1]._4_4_ = 0xffffffff;
    adjustedItemEffectiveBoundingRect((QRectF *)&local_d8,item);
    if (pQVar14 == (QTransform *)0x0) {
      pQVar4 = (item->d_ptr).d;
      pQVar14 = &pQVar4->sceneTransform;
      if (viewTransform == (QTransform *)0x0) {
        bVar10 = (pQVar4->field_0x167 & 0x40) >> 6;
      }
      else {
        pQVar18 = &transform;
        for (lVar16 = 0x4a; lVar16 != 0; lVar16 = lVar16 + -1) {
          *(undefined1 *)pQVar18->m_matrix[0] = *(undefined1 *)pQVar14->m_matrix[0];
          pQVar14 = (QTransform *)((long)pQVar14 + (ulong)bVar23 * -2 + 1);
          pQVar18 = (QTransform *)((long)pQVar18 + (ulong)bVar23 * -2 + 1);
        }
        QTransform::operator*=(&transform,viewTransform);
        bVar10 = 0;
        pQVar14 = &transform;
      }
    }
    else {
      bVar10 = 0;
    }
    local_128.m_matrix[0][2] = -NAN;
    local_128.m_matrix[1][0] = -NAN;
    local_128.m_matrix[0][0] = -NAN;
    local_128.m_matrix[0][1] = -NAN;
    if (bVar10 == 0) {
      QTransform::mapRect((QRectF *)&local_128);
    }
    else {
      local_128.m_matrix[0][0] =
           pQVar14->m_matrix[2][0] +
           (double)CONCAT44(local_d8.m_matrix[0][0]._4_4_,local_d8.m_matrix[0][0]._0_4_);
      local_128.m_matrix[0][1] =
           pQVar14->m_matrix[2][1] +
           (double)CONCAT44(local_d8.m_matrix[0][1]._4_4_,local_d8.m_matrix[0][1]._0_4_);
      local_128.m_matrix[0][2] =
           (qreal)CONCAT44(local_d8.m_matrix[0][2]._4_4_,local_d8.m_matrix[0][2]._0_4_);
      local_128.m_matrix[1][0] =
           (qreal)CONCAT44(local_d8.m_matrix[1][0]._4_4_,local_d8.m_matrix[1][0]._0_4_);
    }
    dVar1 = this->minimumRenderSize;
    if ((dVar1 <= 0.0) ||
       ((cVar11 = '\0', dVar1 <= local_128.m_matrix[0][2] && (dVar1 <= local_128.m_matrix[1][0]))))
    {
      if (!bVar22 || 0.001 > opacity) goto LAB_0059df7f;
      auVar24 = QRectF::toAlignedRect();
      qVar2 = this->rectAdjust;
      info.viewTransform = (QTransform *)CONCAT44(auVar24._4_4_ - qVar2,auVar24._0_4_ - qVar2);
      info.transformPtr = (QTransform *)CONCAT44(auVar24._12_4_ + qVar2,auVar24._8_4_ + qVar2);
      if (widget_local != (QWidget *)0x0) {
        QHash<QWidget*,QRect>::emplace<QRect_const&>
                  ((QHash<QWidget*,QRect> *)&((item->d_ptr).d)->paintedViewBoundingRects,
                   &widget_local,(QRect *)&info);
      }
      if (exposedRegion == (QRegion *)0x0) {
        auVar24 = QRect::normalized();
        cVar11 = auVar24._4_4_ <= auVar24._12_4_ && auVar24._0_4_ <= auVar24._8_4_;
      }
      else {
        cVar11 = QRegion::intersects((QRect *)exposedRegion);
      }
      if (cVar11 != '\0') goto LAB_0059dfdb;
    }
    if (lVar17 == 0) goto LAB_0059e260;
    if ((uVar5 & 0x8001000000000) != 0) {
      if (bVar9 != false) {
        QGraphicsItemPrivate::invalidateChildrenSceneTransform((item->d_ptr).d);
      }
      goto LAB_0059e260;
    }
  }
  else {
    cVar11 = false;
    if (((lVar17 != 0) && (cVar11 = false, pQVar14 == (QTransform *)0x0)) &&
       ((uVar5 & 0x8001000000000) != 0)) {
      pQVar14 = &pQVar4->sceneTransform;
      if (viewTransform == (QTransform *)0x0) {
        cVar11 = false;
      }
      else {
        pQVar18 = &transform;
        for (lVar17 = 0x4a; lVar17 != 0; lVar17 = lVar17 + -1) {
          *(undefined1 *)pQVar18->m_matrix[0] = *(undefined1 *)pQVar14->m_matrix[0];
          pQVar14 = (QTransform *)((long)pQVar14 + (ulong)bVar23 * -2 + 1);
          pQVar18 = (QTransform *)((long)pQVar18 + (ulong)bVar23 * -2 + 1);
        }
        QTransform::operator*=(&transform,viewTransform);
        pQVar14 = &transform;
LAB_0059df7f:
        cVar11 = false;
      }
    }
  }
LAB_0059dfdb:
  pQVar7 = ((item->d_ptr).d)->graphicsEffect;
  if ((pQVar7 == (QGraphicsEffect *)0x0) || (bVar22 = QGraphicsEffect::isEnabled(pQVar7), !bVar22))
  {
    draw(this,item,painter,viewTransform,pQVar14,exposedRegion,widget_local,opacity,effectTransform,
         bVar9,(bool)cVar11);
    goto LAB_0059e260;
  }
  if ((pQVar14 == (QTransform *)0x0) &&
     (pQVar18 = &((item->d_ptr).d)->sceneTransform, pQVar14 = pQVar18,
     viewTransform != (QTransform *)0x0)) {
    pQVar14 = &transform;
    pQVar20 = pQVar14;
    for (lVar17 = 0x4a; lVar17 != 0; lVar17 = lVar17 + -1) {
      *(undefined1 *)pQVar20->m_matrix[0] = *(undefined1 *)pQVar18->m_matrix[0];
      pQVar18 = (QTransform *)((long)pQVar18 + (ulong)bVar23 * -2 + 1);
      pQVar20 = (QTransform *)((long)pQVar20 + (ulong)bVar23 * -2 + 1);
    }
    QTransform::operator*=(pQVar14,viewTransform);
  }
  puVar19 = &DAT_00678e98;
  pQVar21 = &info;
  for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
    pQVar21->viewTransform = (QTransform *)*puVar19;
    puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
    pQVar21 = (QGraphicsItemPaintInfo *)((long)pQVar21 + (ulong)bVar23 * -0x10 + 8);
  }
  info.option = &this->styleOptionTmp;
  info.effectTransform = effectTransform;
  info.widget = widget_local;
  info._64_1_ = bVar8 * '\x02' + bVar9 | 0xa8;
  this_00 = *(QGraphicsItemEffectSourcePrivate **)
             (*(long *)(*(long *)&((item->d_ptr).d)->graphicsEffect->field_0x8 + 0x78) + 8);
  this_00->info = &info;
  info.viewTransform = viewTransform;
  info.transformPtr = pQVar14;
  info.exposedRegion = exposedRegion;
  info.painter = painter;
  info.opacity = opacity;
  pqVar13 = (qreal *)QPainter::worldTransform();
  pQVar18 = &local_d8;
  for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
    pQVar18->m_matrix[0][0] = *pqVar13;
    pqVar13 = pqVar13 + (ulong)bVar23 * -2 + 1;
    pQVar18 = (QTransform *)((long)pQVar18 + ((ulong)bVar23 * -2 + 1) * 8);
  }
  if (effectTransform != (QTransform *)0x0) {
    QTransform::operator*(&local_128,pQVar14);
    pQVar14 = &local_128;
  }
  QPainter::setWorldTransform((QTransform *)painter,SUB81(pQVar14,0));
  QPainter::setOpacity(opacity);
  if ((this_00->super_QGraphicsEffectSourcePrivate).m_cachedSystem != LogicalCoordinates) {
    pQVar14 = (QTransform *)QPainter::worldTransform();
    cVar11 = QTransform::operator!=(&this_00->lastEffectTransform,pQVar14);
    if (cVar11 != '\0') {
      iVar12 = QTransform::type();
      if (iVar12 < 2) {
        QPainter::worldTransform();
        iVar12 = QTransform::type();
        if (1 < iVar12) goto LAB_0059e210;
        local_128.m_matrix[0][2] = -NAN;
        local_128.m_matrix[1][0] = -NAN;
        local_128.m_matrix[0][0] = -NAN;
        local_128.m_matrix[0][1] = -NAN;
        (**(code **)(*(long *)&this_00->super_QGraphicsEffectSourcePrivate + 0x28))
                  ((QRectF *)&local_128,this_00,0);
        QGraphicsItemEffectSourcePrivate::paddedEffectRect
                  (&local_198,this_00,DeviceCoordinates,
                   (this_00->super_QGraphicsEffectSourcePrivate).m_cachedMode,(QRectF *)&local_128,
                   (bool *)0x0);
        local_198.xp = (qreal)QRectF::toAlignedRect();
        QGraphicsEffectSourcePrivate::setCachedOffset
                  (&this_00->super_QGraphicsEffectSourcePrivate,(QPoint *)&local_198);
      }
      else {
LAB_0059e210:
        QGraphicsEffectSourcePrivate::invalidateCache
                  (&this_00->super_QGraphicsEffectSourcePrivate,TransformChanged);
      }
      puVar15 = (undefined1 *)QPainter::worldTransform();
      pQVar14 = &this_00->lastEffectTransform;
      for (lVar17 = 0x4a; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(undefined1 *)pQVar14->m_matrix[0] = *puVar15;
        puVar15 = puVar15 + (ulong)bVar23 * -2 + 1;
        pQVar14 = (QTransform *)((long)pQVar14 + (ulong)bVar23 * -2 + 1);
      }
    }
  }
  pQVar7 = ((item->d_ptr).d)->graphicsEffect;
  (**(code **)(*(long *)pQVar7 + 0x68))(pQVar7,painter);
  QPainter::setWorldTransform((QTransform *)painter,SUB81(&local_d8,0));
  this_00->info = (QGraphicsItemPaintInfo *)0x0;
LAB_0059e260:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::drawSubtreeRecursive(QGraphicsItem *item, QPainter *painter,
                                                 const QTransform *const viewTransform,
                                                 QRegion *exposedRegion, QWidget *widget,
                                                 qreal parentOpacity, const QTransform *const effectTransform)
{
    Q_ASSERT(item);

    if (!item->d_ptr->visible)
        return;

    const bool itemHasContents = !(item->d_ptr->flags & QGraphicsItem::ItemHasNoContents);
    const bool itemHasChildren = !item->d_ptr->children.isEmpty();
    if (!itemHasContents && !itemHasChildren)
        return; // Item has neither contents nor children!(?)

    const qreal opacity = item->d_ptr->combineOpacityFromParent(parentOpacity);
    const bool itemIsFullyTransparent = QGraphicsItemPrivate::isOpacityNull(opacity);
    if (itemIsFullyTransparent && (!itemHasChildren || item->d_ptr->childrenCombineOpacity()))
        return;

    QTransform transform(Qt::Uninitialized);
    QTransform *transformPtr = nullptr;
    bool translateOnlyTransform = false;
#define ENSURE_TRANSFORM_PTR \
    if (!transformPtr) { \
        Q_ASSERT(!itemIsUntransformable); \
        if (viewTransform) { \
            transform = item->d_ptr->sceneTransform; \
            transform *= *viewTransform; \
            transformPtr = &transform; \
        } else { \
            transformPtr = &item->d_ptr->sceneTransform; \
            translateOnlyTransform = item->d_ptr->sceneTransformTranslateOnly; \
        } \
    }

    // Update the item's scene transform if the item is transformable;
    // otherwise calculate the full transform,
    bool wasDirtyParentSceneTransform = false;
    const bool itemIsUntransformable = item->d_ptr->itemIsUntransformable();
    if (itemIsUntransformable) {
        transform = item->deviceTransform(viewTransform ? *viewTransform : QTransform());
        transformPtr = &transform;
    } else if (item->d_ptr->dirtySceneTransform) {
        item->d_ptr->updateSceneTransformFromParent();
        Q_ASSERT(!item->d_ptr->dirtySceneTransform);
        wasDirtyParentSceneTransform = true;
    }

    const bool itemClipsChildrenToShape = (item->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape
                                           || item->d_ptr->flags & QGraphicsItem::ItemContainsChildrenInShape);
    bool drawItem = itemHasContents && !itemIsFullyTransparent;
    if (drawItem || minimumRenderSize > 0.0) {
        const QRectF brect = adjustedItemEffectiveBoundingRect(item);
        ENSURE_TRANSFORM_PTR
        QRectF preciseViewBoundingRect = translateOnlyTransform ? brect.translated(transformPtr->dx(), transformPtr->dy())
                                                                : transformPtr->mapRect(brect);

        bool itemIsTooSmallToRender = false;
        if (minimumRenderSize > 0.0
            && (preciseViewBoundingRect.width() < minimumRenderSize
                || preciseViewBoundingRect.height() < minimumRenderSize)) {
           itemIsTooSmallToRender = true;
           drawItem = false;
        }

        bool itemIsOutsideVisibleRect = false;
        if (drawItem) {
            QRect viewBoundingRect = preciseViewBoundingRect.toAlignedRect();
            viewBoundingRect.adjust(-int(rectAdjust), -int(rectAdjust), rectAdjust, rectAdjust);
            if (widget)
                item->d_ptr->paintedViewBoundingRects.insert(widget, viewBoundingRect);
            drawItem = exposedRegion ? exposedRegion->intersects(viewBoundingRect)
                                     : !viewBoundingRect.normalized().isEmpty();
            itemIsOutsideVisibleRect = !drawItem;
        }

        if (itemIsTooSmallToRender || itemIsOutsideVisibleRect) {
            // We cannot simply use !drawItem here. If we did it is possible
            // to enter the outer if statement with drawItem == false and minimumRenderSize > 0
            // and finally end up inside this inner if, even though none of the above two
            // conditions are met. In that case we should not return from this function
            // but call draw() instead.
            if (!itemHasChildren)
                return;
            if (itemClipsChildrenToShape) {
                if (wasDirtyParentSceneTransform)
                    item->d_ptr->invalidateChildrenSceneTransform();
                return;
            }
        }
    } // else we know for sure this item has children we must process.

    if (itemHasChildren && itemClipsChildrenToShape)
        ENSURE_TRANSFORM_PTR;

#if QT_CONFIG(graphicseffect)
    if (item->d_ptr->graphicsEffect && item->d_ptr->graphicsEffect->isEnabled()) {
        ENSURE_TRANSFORM_PTR;
        QGraphicsItemPaintInfo info(viewTransform, transformPtr, effectTransform, exposedRegion, widget, &styleOptionTmp,
                                    painter, opacity, wasDirtyParentSceneTransform, itemHasContents && !itemIsFullyTransparent);
        QGraphicsEffectSource *source = item->d_ptr->graphicsEffect->d_func()->source;
        QGraphicsItemEffectSourcePrivate *sourced = static_cast<QGraphicsItemEffectSourcePrivate *>
                                                    (source->d_func());
        sourced->info = &info;
        const QTransform restoreTransform = painter->worldTransform();
        if (effectTransform)
            painter->setWorldTransform(*transformPtr * *effectTransform);
        else
            painter->setWorldTransform(*transformPtr);
        painter->setOpacity(opacity);

        if (sourced->currentCachedSystem() != Qt::LogicalCoordinates
            && sourced->lastEffectTransform != painter->worldTransform())
        {
            if (sourced->lastEffectTransform.type() <= QTransform::TxTranslate
                && painter->worldTransform().type() <= QTransform::TxTranslate)
            {
                QRectF sourceRect = sourced->boundingRect(Qt::DeviceCoordinates);
                QRect effectRect = sourced->paddedEffectRect(Qt::DeviceCoordinates, sourced->currentCachedMode(), sourceRect).toAlignedRect();

                sourced->setCachedOffset(effectRect.topLeft());
            } else {
                sourced->invalidateCache(QGraphicsEffectSourcePrivate::TransformChanged);
            }

            sourced->lastEffectTransform = painter->worldTransform();
        }

        item->d_ptr->graphicsEffect->draw(painter);
        painter->setWorldTransform(restoreTransform);
        sourced->info = nullptr;
    } else
#endif // QT_CONFIG(graphicseffect)
    {
        draw(item, painter, viewTransform, transformPtr, exposedRegion, widget, opacity,
             effectTransform, wasDirtyParentSceneTransform, drawItem);
    }
}